

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.c
# Opt level: O2

int worker_wait_idle(worker_handle *wh)

{
  mutex_handle *mutex;
  void *pvVar1;
  int iVar2;
  
  pvVar1 = wh->priv;
  mutex = (mutex_handle *)((long)pvVar1 + 0x10);
  mutex_lock(mutex);
  iVar2 = -0x16;
  while (*(uint *)((long)pvVar1 + 0x38) < 5) {
    if (*(uint *)((long)pvVar1 + 0x38) < 3) goto LAB_00106f09;
    condvar_wait((condvar_handle *)((long)pvVar1 + 8),mutex);
  }
  iVar2 = 0;
LAB_00106f09:
  mutex_unlock(mutex);
  return iVar2;
}

Assistant:

int worker_wait_idle(struct worker_handle *wh)
{
	struct worker_priv *priv = wh->priv;
	int ret = 0;

	mutex_lock(&priv->mutex);

	while (priv->state < WORKER_IDLE) {
		if (priv->state < WORKER_BUSY) {
			ret = -EINVAL;
			break;
		}

		condvar_wait(&priv->condvar_idle, &priv->mutex);
	}

	mutex_unlock(&priv->mutex);

	return ret;
}